

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

GeneratorVirtualScriptFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  bool bVar1;
  Recycler *pRVar2;
  JavascriptLibrary *pJVar3;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_e9;
  TrackAllocData local_e8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_b9;
  TrackAllocData local_b8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_89;
  TrackAllocData local_88;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_59;
  TrackAllocData local_58;
  FunctionInfo *local_30;
  FunctionInfo *functionInfo;
  ScriptFunctionType *deferredPrototypeType;
  FunctionProxy *proxy_local;
  JavascriptLibrary *this_local;
  
  deferredPrototypeType = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  functionInfo = (FunctionInfo *)FunctionProxy::EnsureDeferredPrototypeType(proxy);
  local_30 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType);
  bVar1 = FunctionInfo::HasComputedName(local_30);
  if ((bVar1) || (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
    bVar1 = FunctionInfo::HasComputedName(local_30);
    if ((bVar1) && (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
      pRVar2 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x1925);
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_58);
      pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x60,pRVar2,&local_59);
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::
      FunctionWithComputedName
                ((FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
                  *)pJVar3,(FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo
                );
      this_local = pJVar3;
    }
    else {
      bVar1 = FunctionInfo::HasHomeObj(local_30);
      if (bVar1) {
        pRVar2 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_88,
                   (type_info *)&FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::typeinfo,0
                   ,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x1929);
        pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_88);
        pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x58,pRVar2,&local_89);
        FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::FunctionWithHomeObj
                  ((FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *)pJVar3,
                   (FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo);
        this_local = pJVar3;
      }
      else {
        pRVar2 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b8,
                   (type_info *)
                   &FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x192b);
        pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_b8);
        pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x58,pRVar2,&local_b9);
        FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::FunctionWithComputedName
                  ((FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)pJVar3,
                   (FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo);
        this_local = pJVar3;
      }
    }
  }
  else {
    pRVar2 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&GeneratorVirtualScriptFunction::typeinfo,0,0xffffffffffffffff
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x192d);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_e8);
    pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x50,pRVar2,&local_e9);
    GeneratorVirtualScriptFunction::GeneratorVirtualScriptFunction
              ((GeneratorVirtualScriptFunction *)pJVar3,(FunctionProxy *)deferredPrototypeType,
               (ScriptFunctionType *)functionInfo);
    this_local = pJVar3;
  }
  return (GeneratorVirtualScriptFunction *)this_local;
}

Assistant:

GeneratorVirtualScriptFunction* JavascriptLibrary::CreateGeneratorVirtualScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<GeneratorVirtualScriptFunction>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<GeneratorVirtualScriptFunction>, proxy, deferredPrototypeType);
            }
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunction, proxy, deferredPrototypeType);
    }